

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

double nrm2(cupdlp_int n,double *x,cupdlp_int incx)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (0 < n) {
    uVar1 = 0;
    do {
      dVar2 = dVar2 + x[uVar1] * x[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  if (0.0 <= dVar2) {
    return SQRT(dVar2);
  }
  dVar2 = sqrt(dVar2);
  return dVar2;
}

Assistant:

double nrm2(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;

  for (int i = 0; i < n; ++i) {
    nrm += x[i] * x[i];
  }

  return sqrt(nrm);
#else
  return dnrm2(n, x, incx);
#endif
}